

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pass.cpp
# Opt level: O3

string * __thiscall
wasm::Pass::getArgumentOrDefault
          (string *__return_storage_ptr__,Pass *this,string *key,string *defaultValue)

{
  size_t __n;
  PassRunner *pPVar1;
  int iVar2;
  pointer pcVar3;
  string local_70;
  string local_50;
  
  __n = key->_M_string_length;
  if (__n == (this->name)._M_string_length) {
    if (__n != 0) {
      pcVar3 = (key->_M_dataplus)._M_p;
      iVar2 = bcmp(pcVar3,(this->name)._M_dataplus._M_p,__n);
      if (iVar2 != 0) goto LAB_0078e1dc;
    }
    if ((this->passArg).
        super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
        ._M_payload.
        super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
        .
        super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ._M_engaged != false) {
      defaultValue = (string *)&this->passArg;
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar3 = (defaultValue->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,pcVar3,pcVar3 + defaultValue->_M_string_length);
  }
  else {
    pcVar3 = (key->_M_dataplus)._M_p;
LAB_0078e1dc:
    pPVar1 = this->runner;
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char*>((string *)&local_50,pcVar3,pcVar3 + __n);
    pcVar3 = (defaultValue->_M_dataplus)._M_p;
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_70,pcVar3,pcVar3 + defaultValue->_M_string_length);
    PassOptions::getArgumentOrDefault(__return_storage_ptr__,&pPVar1->options,&local_50,&local_70);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Pass::getArgumentOrDefault(const std::string& key,
                                       const std::string& defaultValue) {
  if (key == name) {
    return passArg.value_or(defaultValue);
  }

  return getPassOptions().getArgumentOrDefault(key, defaultValue);
}